

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_value_pointer(sqlite3_value *pVal,char *zPType)

{
  int iVar1;
  Mem *p;
  char *zPType_local;
  sqlite3_value *pVal_local;
  
  if (((((pVal->flags & 0xc3ff) == 0x8201) && (zPType != (char *)0x0)) && (pVal->eSubtype == 'p'))
     && (iVar1 = strcmp((pVal->u).zPType,zPType), iVar1 == 0)) {
    return pVal->z;
  }
  return (void *)0x0;
}

Assistant:

SQLITE_API void *sqlite3_value_pointer(sqlite3_value *pVal, const char *zPType){
  Mem *p = (Mem*)pVal;
  if( (p->flags&(MEM_TypeMask|MEM_Term|MEM_Subtype)) ==
                 (MEM_Null|MEM_Term|MEM_Subtype)
   && zPType!=0
   && p->eSubtype=='p'
   && strcmp(p->u.zPType, zPType)==0
  ){
    return (void*)p->z;
  }else{
    return 0;
  }
}